

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::addMaterial(XMLLoader *this,string *type,Parms *parms)

{
  bool bVar1;
  ostream *poVar2;
  _func_int **pp_Var3;
  string *in_RDX;
  MaterialNode *in_RDI;
  float ny;
  float nx;
  Vec3fa Kt_1;
  Vec3fa Kr;
  float eta_3;
  float glitterSpread;
  Vec3fa glitterColor;
  Vec3fa shadeColor;
  float etaInside;
  float etaOutside;
  Vec3fa transmissionInside;
  Vec3fa transmissionOutside;
  float horizonScatteringFallOff;
  Vec3fa horizonScatteringColor;
  float backScattering;
  Vec3fa reflectance_3;
  float roughness_1;
  Vec3fa k;
  Vec3fa eta_2;
  Vec3fa reflectance_2;
  float roughness;
  float eta_1;
  Vec3fa pigmentColor;
  float thickness;
  float eta;
  Vec3fa transmission;
  float Ns_1;
  Vec3fa Ks_1;
  Vec3fa Kd_1;
  float d_1;
  shared_ptr<embree::Texture> map_Displ;
  shared_ptr<embree::Texture> map_Ns;
  float Ns;
  shared_ptr<embree::Texture> map_Kt;
  Vec3fa Kt;
  shared_ptr<embree::Texture> map_Ks;
  Vec3fa Ks;
  shared_ptr<embree::Texture> map_Kd;
  Vec3fa Kd;
  shared_ptr<embree::Texture> map_Ka;
  Vec3fa Ka;
  shared_ptr<embree::Texture> map_d;
  float d;
  Vec3fa reflectance_1;
  Vec3fa reflectance;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff460;
  Vec3fa *in_stack_fffffffffffff498;
  MatteMaterial *in_stack_fffffffffffff4a0;
  Vec3fa *in_stack_fffffffffffff4a8;
  Vec3fa *Kr_00;
  MetalMaterial *in_stack_fffffffffffff4b0;
  HairMaterial *this_00;
  Vec3fa *in_stack_fffffffffffff4b8;
  MetalMaterial *in_stack_fffffffffffff4c0;
  OBJMaterial *in_stack_fffffffffffff4c8;
  float fVar4;
  float def;
  Vec3fa *in_stack_fffffffffffff4d0;
  char *name;
  ThinDielectricMaterial *in_stack_fffffffffffff4d8;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff4e0;
  Parms *in_stack_fffffffffffff4e8;
  Vec3fa *in_stack_fffffffffffff4f0;
  Vec3fa *in_stack_fffffffffffff4f8;
  Parms *in_stack_fffffffffffff500;
  undefined8 in_stack_fffffffffffff508;
  float fVar6;
  undefined1 *puVar5;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  Vec3fa *in_stack_fffffffffffff560;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff568;
  Vec3fa *in_stack_fffffffffffff570;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff578;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff580;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff588;
  allocator local_999;
  string local_998 [32];
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  float local_954;
  float local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined1 local_938 [80];
  size_t local_8e8 [2];
  char local_8d8 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_8b8;
  undefined1 local_8a8 [20];
  float local_894;
  float local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  Vec3fa local_878 [2];
  undefined8 local_858;
  undefined8 uStack_850;
  float local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  float local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  float local_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_778;
  undefined8 uStack_770;
  float local_754;
  float local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_724;
  float local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined1 local_6f2;
  allocator local_6f1;
  string local_6f0 [32];
  float local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_698;
  undefined8 uStack_690;
  float local_670;
  undefined1 local_669;
  float local_5d4;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_478;
  undefined8 uStack_470;
  string *local_448;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  size_t *local_410;
  undefined8 *local_408;
  _func_int **local_400;
  _func_int **local_3f0;
  _func_int **local_3e0;
  _func_int **local_3d0;
  _func_int **local_3c0;
  _func_int **local_3b0;
  _func_int **local_3a0;
  _func_int **local_390;
  _func_int **local_380;
  _func_int **local_370;
  _func_int **local_360;
  _func_int **local_350;
  _func_int **local_340;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2d8;
  undefined1 *local_2d0;
  undefined4 local_2c4;
  undefined8 *local_2c0;
  undefined4 local_2b4;
  undefined8 *local_2b0;
  undefined4 local_2a4;
  undefined8 *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_4;
  
  fVar6 = (float)((ulong)in_stack_fffffffffffff508 >> 0x20);
  local_448 = in_RDX;
  bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
  if (bVar1) {
    local_330 = &local_478;
    local_4 = 0x3f800000;
    local_18 = 0x3f800000;
    uStack_14 = 0x3f800000;
    uStack_10 = 0x3f800000;
    uStack_c = 0x3f800000;
    local_478 = 0x3f8000003f800000;
    uStack_470 = 0x3f8000003f800000;
    Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                     in_stack_fffffffffffff4f0);
    pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x384a08);
    MatteMaterial::MatteMaterial(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      local_400 = pp_Var3;
      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
    if (bVar1) {
      local_328 = &local_4b8;
      local_1c = 0x3f800000;
      local_38 = 0x3f800000;
      uStack_34 = 0x3f800000;
      uStack_30 = 0x3f800000;
      uStack_2c = 0x3f800000;
      local_4b8 = 0x3f8000003f800000;
      uStack_4b0 = 0x3f8000003f800000;
      Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                       in_stack_fffffffffffff4f0);
      pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x384b30);
      MirrorMaterial::MirrorMaterial
                ((MirrorMaterial *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
      (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
      if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
        local_3f0 = pp_Var3;
        (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
      if (bVar1) {
        local_4c0 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                    (char *)in_stack_fffffffffffff4d0,
                                    (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
        fVar4 = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        local_430 = &local_4f8;
        local_228 = 0;
        uStack_220 = 0;
        local_4f8 = 0;
        uStack_4f0 = 0;
        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                         in_stack_fffffffffffff4f0);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        local_320 = &local_538;
        local_48 = 0x3f800000;
        local_58 = 0x3f800000;
        uStack_54 = 0x3f800000;
        uStack_50 = 0x3f800000;
        uStack_4c = 0x3f800000;
        local_538 = 0x3f8000003f800000;
        uStack_530 = 0x3f8000003f800000;
        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                         in_stack_fffffffffffff4f0);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        local_428 = &local_578;
        local_238 = 0;
        uStack_230 = 0;
        local_578 = 0;
        uStack_570 = 0;
        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                         in_stack_fffffffffffff4f0);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        local_420 = &local_5b8;
        local_248 = 0;
        uStack_240 = 0;
        local_5b8 = 0;
        uStack_5b0 = 0;
        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                         in_stack_fffffffffffff4f0);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        local_5d4 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                    (char *)in_stack_fffffffffffff4d0,fVar4);
        fVar4 = (float)((ulong)in_stack_fffffffffffff4d8 >> 0x20);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        Parms::getTexture(in_stack_fffffffffffff4e8,(char *)in_stack_fffffffffffff4e0);
        pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x384ec3);
        local_669 = 1;
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        std::shared_ptr<embree::Texture>::shared_ptr
                  ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458);
        OBJMaterial::OBJMaterial
                  ((OBJMaterial *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                   fVar6,(shared_ptr<embree::Texture> *)in_stack_fffffffffffff500,
                   in_stack_fffffffffffff4f8,
                   (shared_ptr<embree::Texture> *)in_stack_fffffffffffff4f0,
                   (Vec3fa *)in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
                   in_stack_fffffffffffff560,in_stack_fffffffffffff568,in_stack_fffffffffffff570,
                   in_stack_fffffffffffff578,fVar4,in_stack_fffffffffffff580,
                   in_stack_fffffffffffff588);
        local_669 = 0;
        (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
        local_3e0 = pp_Var3;
        if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
        }
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3850c7);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3850d4);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3850e1);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3850ee);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x3850fb);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385108);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385115);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385122);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x38512f);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x38513c);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385149);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385156);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385163);
        std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x385170);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
        if (bVar1) {
          local_670 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                      (char *)in_stack_fffffffffffff4d0,
                                      (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
          fVar4 = (float)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
          fVar6 = (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20);
          local_318 = &local_698;
          local_5c = 0x3f800000;
          local_78 = 0x3f800000;
          uStack_74 = 0x3f800000;
          uStack_70 = 0x3f800000;
          uStack_6c = 0x3f800000;
          local_698 = 0x3f8000003f800000;
          uStack_690 = 0x3f8000003f800000;
          Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                           in_stack_fffffffffffff4f0);
          local_418 = &local_6c8;
          local_258 = 0;
          uStack_250 = 0;
          local_6c8 = 0;
          uStack_6c0 = 0;
          Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                           in_stack_fffffffffffff4f0);
          local_6d0 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                      (char *)in_stack_fffffffffffff4d0,
                                      (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
          pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385428);
          local_6f2 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6f0,"",&local_6f1);
          OBJMaterial::OBJMaterial
                    (in_stack_fffffffffffff4c8,fVar4,in_stack_fffffffffffff4b8,
                     (Vec3fa *)in_stack_fffffffffffff4b0,fVar6,(string *)in_stack_fffffffffffff4a0);
          local_6f2 = 0;
          (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
          local_3d0 = pp_Var3;
          if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
          }
          std::__cxx11::string::~string(local_6f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
          if ((bVar1) ||
             (bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458),
             bVar1)) {
            local_310 = &local_718;
            local_7c = 0x3f800000;
            local_98 = 0x3f800000;
            uStack_94 = 0x3f800000;
            uStack_90 = 0x3f800000;
            uStack_8c = 0x3f800000;
            local_718 = 0x3f8000003f800000;
            uStack_710 = 0x3f8000003f800000;
            Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                             in_stack_fffffffffffff4f0);
            local_720 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                        (char *)in_stack_fffffffffffff4d0,
                                        (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
            local_724 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                        (char *)in_stack_fffffffffffff4d0,
                                        (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
            pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x38569c);
            ThinDielectricMaterial::ThinDielectricMaterial
                      (in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,
                       (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20),
                       SUB84(in_stack_fffffffffffff4c8,0));
            (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
            if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
              local_3c0 = pp_Var3;
              (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
            }
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
            if (bVar1) {
              local_308 = &local_748;
              local_9c = 0x3f800000;
              local_b8 = 0x3f800000;
              uStack_b4 = 0x3f800000;
              uStack_b0 = 0x3f800000;
              uStack_ac = 0x3f800000;
              local_748 = 0x3f8000003f800000;
              fVar6 = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
              uStack_740 = 0x3f8000003f800000;
              Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                               in_stack_fffffffffffff4f0);
              local_750 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                          (char *)in_stack_fffffffffffff4d0,fVar6);
              local_754 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                          (char *)in_stack_fffffffffffff4d0,fVar6);
              pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385820);
              MetallicPaintMaterial::MetallicPaintMaterial
                        ((MetallicPaintMaterial *)in_stack_fffffffffffff4b0,
                         in_stack_fffffffffffff4a8,(Vec3fa *)in_stack_fffffffffffff4a0,
                         (float)((ulong)in_stack_fffffffffffff498 >> 0x20),
                         SUB84(in_stack_fffffffffffff498,0));
              (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
              if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                local_3b0 = pp_Var3;
                (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
              }
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
              if (bVar1) {
                local_300 = &local_778;
                local_bc = 0x3f800000;
                local_d8 = 0x3f800000;
                uStack_d4 = 0x3f800000;
                uStack_d0 = 0x3f800000;
                uStack_cc = 0x3f800000;
                local_778 = 0x3f8000003f800000;
                fVar6 = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
                uStack_770 = 0x3f8000003f800000;
                Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                 in_stack_fffffffffffff4f0);
                local_2c0 = &local_7a8;
                local_2c4 = 0x3fb33333;
                local_19c = 0x3fb33333;
                local_1b8 = 0x3fb33333;
                uStack_1b4 = 0x3fb33333;
                uStack_1b0 = 0x3fb33333;
                uStack_1ac = 0x3fb33333;
                local_7a8 = 0x3fb333333fb33333;
                uStack_7a0 = 0x3fb333333fb33333;
                Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                 in_stack_fffffffffffff4f0);
                local_2b0 = &local_7c8;
                local_2b4 = 0;
                local_1c8 = 0;
                local_1d8 = 0;
                uStack_1d4 = 0;
                uStack_1d0 = 0;
                uStack_1cc = 0;
                local_7c8 = 0;
                uStack_7c0 = 0;
                Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                 in_stack_fffffffffffff4f0);
                local_7cc = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                            (char *)in_stack_fffffffffffff4d0,fVar6);
                if ((local_7cc != 0.0) || (NAN(local_7cc))) {
                  pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385b32);
                  MetalMaterial::MetalMaterial
                            (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                             (Vec3fa *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                             (float)((ulong)in_stack_fffffffffffff4a0 >> 0x20));
                  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                    local_390 = pp_Var3;
                    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
                  }
                }
                else {
                  pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385a7e);
                  MetalMaterial::MetalMaterial
                            (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                             (Vec3fa *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
                  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                    local_3a0 = pp_Var3;
                    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
                  }
                }
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458)
                ;
                if (bVar1) {
                  local_2f8 = &local_7f8;
                  local_dc = 0x3f800000;
                  local_f8 = 0x3f800000;
                  uStack_f4 = 0x3f800000;
                  uStack_f0 = 0x3f800000;
                  uStack_ec = 0x3f800000;
                  local_7f8 = 0x3f8000003f800000;
                  fVar4 = (float)((ulong)in_stack_fffffffffffff4b0 >> 0x20);
                  fVar6 = (float)((ulong)in_stack_fffffffffffff4a0 >> 0x20);
                  def = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
                  uStack_7f0 = 0x3f8000003f800000;
                  Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                   in_stack_fffffffffffff4f0);
                  puVar5 = &embree::zero;
                  local_280 = &embree::zero;
                  local_800 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                              (char *)in_stack_fffffffffffff4d0,def);
                  local_2f0 = &local_828;
                  local_fc = 0x3f800000;
                  local_118 = 0x3f800000;
                  uStack_114 = 0x3f800000;
                  uStack_110 = 0x3f800000;
                  uStack_10c = 0x3f800000;
                  local_828 = 0x3f8000003f800000;
                  uStack_820 = 0x3f8000003f800000;
                  Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                   in_stack_fffffffffffff4f0);
                  local_288 = puVar5;
                  local_830 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                              (char *)in_stack_fffffffffffff4d0,def);
                  pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385d50);
                  VelvetMaterial::VelvetMaterial
                            ((VelvetMaterial *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                             fVar4,in_stack_fffffffffffff4a8,fVar6);
                  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                    local_380 = pp_Var3;
                    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
                  }
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffff460,
                                          (char *)in_stack_fffffffffffff458);
                  fVar6 = (float)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
                  if (bVar1) {
                    local_2e8 = &local_858;
                    local_11c = 0x3f800000;
                    local_138 = 0x3f800000;
                    uStack_134 = 0x3f800000;
                    uStack_130 = 0x3f800000;
                    uStack_12c = 0x3f800000;
                    local_858 = 0x3f8000003f800000;
                    fVar6 = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
                    uStack_850 = 0x3f8000003f800000;
                    Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                     in_stack_fffffffffffff4f0);
                    local_2e0 = &local_888;
                    local_13c = 0x3f800000;
                    local_158 = 0x3f800000;
                    uStack_154 = 0x3f800000;
                    uStack_150 = 0x3f800000;
                    uStack_14c = 0x3f800000;
                    local_888 = 0x3f8000003f800000;
                    uStack_880 = 0x3f8000003f800000;
                    Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                     local_878);
                    local_890 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                                (char *)in_stack_fffffffffffff4d0,fVar6);
                    local_894 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                                (char *)in_stack_fffffffffffff4d0,fVar6);
                    pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x385f43);
                    DielectricMaterial::DielectricMaterial
                              ((DielectricMaterial *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,(Vec3fa *)in_stack_fffffffffffff4a0,
                               (float)((ulong)in_stack_fffffffffffff498 >> 0x20),
                               SUB84(in_stack_fffffffffffff498,0));
                    (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                      local_370 = pp_Var3;
                      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
                    }
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffff460,
                                            (char *)in_stack_fffffffffffff458);
                    if (bVar1) {
                      local_2d8 = &local_8b8;
                      local_15c = 0x3f800000;
                      local_178 = 0x3f800000;
                      uStack_174 = 0x3f800000;
                      uStack_170 = 0x3f800000;
                      uStack_16c = 0x3f800000;
                      local_8b8._0_8_ = 0x3f8000003f800000;
                      local_8b8._8_8_ = 0x3f8000003f800000;
                      fVar6 = (float)((ulong)local_8a8 >> 0x20);
                      Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                       in_stack_fffffffffffff4f0);
                      local_410 = local_8e8;
                      local_268 = 0;
                      uStack_260 = 0;
                      local_8e8[0] = 0;
                      local_8e8[1]._0_1_ = false;
                      local_8e8[1]._1_1_ = false;
                      local_8e8[1]._2_2_ = 0;
                      local_8e8[1]._4_4_ = 0;
                      name = local_8d8;
                      Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8,
                                       in_stack_fffffffffffff4f0);
                      local_938._72_4_ =
                           Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,name,fVar6);
                      local_938._68_4_ =
                           Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,name,fVar6);
                      pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x38611b);
                      MetallicPaintMaterial::MetallicPaintMaterial
                                ((MetallicPaintMaterial *)in_stack_fffffffffffff4b0,
                                 in_stack_fffffffffffff4a8,(Vec3fa *)in_stack_fffffffffffff4a0,
                                 (float)((ulong)in_stack_fffffffffffff498 >> 0x20),
                                 SUB84(in_stack_fffffffffffff498,0));
                      (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                      if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
                        local_360 = pp_Var3;
                        (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
                      }
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffff460,
                                              (char *)in_stack_fffffffffffff458);
                      fVar4 = (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20);
                      if (bVar1) {
                        local_2d0 = local_938 + 0x20;
                        local_17c = 0x3f800000;
                        local_198 = 0x3f800000;
                        uStack_194 = 0x3f800000;
                        uStack_190 = 0x3f800000;
                        uStack_18c = 0x3f800000;
                        local_938._32_8_ = 0x3f8000003f800000;
                        fVar6 = (float)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
                        local_938._40_8_ = 0x3f8000003f800000;
                        Kr_00 = (Vec3fa *)(local_938 + 0x30);
                        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8
                                         ,in_stack_fffffffffffff4f0);
                        local_408 = &local_948;
                        local_278 = 0;
                        uStack_270 = 0;
                        local_948 = 0;
                        uStack_940 = 0;
                        this_00 = (HairMaterial *)local_938;
                        Parms::getVec3fa(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8
                                         ,in_stack_fffffffffffff4f0);
                        local_950 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                                    (char *)in_stack_fffffffffffff4d0,fVar6);
                        local_954 = Parms::getFloat((Parms *)in_stack_fffffffffffff4d8,
                                                    (char *)in_stack_fffffffffffff4d0,fVar6);
                        pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x3862e7);
                        HairMaterial::HairMaterial
                                  (this_00,Kr_00,(Vec3fa *)in_stack_fffffffffffff4a0,
                                   (float)((ulong)in_stack_fffffffffffff498 >> 0x20),
                                   SUB84(in_stack_fffffffffffff498,0));
                        (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                        if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0)
                        {
                          local_350 = pp_Var3;
                          (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))
                                    ();
                        }
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "Warning: unsupported material ");
                        poVar2 = std::operator<<(poVar2,local_448);
                        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                        pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x3863c2);
                        local_2a0 = &local_968;
                        local_2a4 = 0x3f000000;
                        local_1e8 = 0x3f000000;
                        local_1f8 = 0x3f000000;
                        uStack_1f4 = 0x3f000000;
                        uStack_1f0 = 0x3f000000;
                        uStack_1ec = 0x3f000000;
                        local_968 = 0x3f0000003f000000;
                        uStack_960 = 0x3f0000003f000000;
                        local_290 = &local_978;
                        local_294 = 0;
                        local_208 = 0;
                        local_218 = 0;
                        uStack_214 = 0;
                        uStack_210 = 0;
                        uStack_20c = 0;
                        local_978 = 0;
                        uStack_970 = 0;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_998,"",&local_999);
                        OBJMaterial::OBJMaterial
                                  (in_stack_fffffffffffff4c8,fVar6,in_stack_fffffffffffff4b8,
                                   (Vec3fa *)in_stack_fffffffffffff4b0,fVar4,
                                   (string *)in_stack_fffffffffffff4a0);
                        (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
                        local_340 = pp_Var3;
                        if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0)
                        {
                          (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))
                                    ();
                        }
                        std::__cxx11::string::~string(local_998);
                        std::allocator<char>::~allocator((allocator<char> *)&local_999);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Ref<embree::SceneGraph::MaterialNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::addMaterial(const std::string& type, const Parms& parms) 
  {
    if (type == "Matte")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MatteMaterial(reflectance);
    }
    else if (type == "Mirror")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MirrorMaterial(reflectance);
    }
    else if (type == "OBJ") 
    {
      const float d = parms.getFloat("d", 1.0f);
      const std::shared_ptr<Texture> map_d = parms.getTexture("map_d");  
      const Vec3fa Ka = parms.getVec3fa("Ka", zero);
      const std::shared_ptr<Texture> map_Ka = parms.getTexture("map_Ka");  
      const Vec3fa Kd = parms.getVec3fa("Kd", one);
      const std::shared_ptr<Texture> map_Kd = parms.getTexture("map_Kd");  
      const Vec3fa Ks = parms.getVec3fa("Ks", zero);
      const std::shared_ptr<Texture> map_Ks = parms.getTexture("map_Ks");  
      const Vec3fa Kt = parms.getVec3fa("Kt", zero);
      const std::shared_ptr<Texture> map_Kt = parms.getTexture("map_Kt");  
      const float Ns = parms.getFloat("Ns", 10.0f); 
      const std::shared_ptr<Texture> map_Ns = parms.getTexture("map_Ns");  
      const std::shared_ptr<Texture> map_Displ = parms.getTexture("map_Displ");
      return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
    }
    else if (type == "OBJMaterial")  // for BGF file format
    {
      //map_d = parms.getTexture("map_d");  
      const float d = parms.getFloat("d", 1.0f);
      //map_Kd = parms.getTexture("map_kd");  
      const Vec3fa Kd = parms.getVec3fa("kd", one);
      //map_Ks = parms.getTexture("map_ks");  
      const Vec3fa Ks = parms.getVec3fa("ks", zero);
      //map_Ns = parms.getTexture("map_ns");  
      const float Ns = parms.getFloat("ns", 10.0f);
      //map_Bump = parms.getTexture("map_Bump");
      return new OBJMaterial(d,Kd,Ks,Ns);
    }
    else if (type == "ThinDielectric" || type == "ThinGlass")
    {
      const Vec3fa transmission = parms.getVec3fa("transmission",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float thickness    = parms.getFloat("thickness",0.1f);
      return new ThinDielectricMaterial(transmission,eta,thickness);
    }
    else if (type == "Plastic")
    {
      const Vec3fa pigmentColor = parms.getVec3fa("pigmentColor",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float roughness    = parms.getFloat("roughness",0.01f);
      return new MetallicPaintMaterial(pigmentColor,pigmentColor,roughness,eta);
    }
    else if (type == "Metal")
    {
      const Vec3fa reflectance  = parms.getVec3fa("reflectance",one);
      const Vec3fa eta          = parms.getVec3fa("eta",Vec3fa(1.4f));
      const Vec3fa k            = parms.getVec3fa("k",Vec3fa(0.0f));
      const float roughness     = parms.getFloat("roughness",0.01f);
      if (roughness == 0.0f)
        return new MetalMaterial(reflectance,eta,k);
      else 
        return new MetalMaterial(reflectance,eta,k,roughness);
    }
    else if (type == "Velvet")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      const float backScattering = parms.getFloat("backScattering",zero);
      const Vec3fa horizonScatteringColor = parms.getVec3fa("horizonScatteringColor",one);
      const float horizonScatteringFallOff = parms.getFloat("horizonScatteringFallOff",zero);
      return new VelvetMaterial(reflectance,backScattering,horizonScatteringColor,horizonScatteringFallOff);
    }
    else if (type == "Dielectric")
    {
      const Vec3fa transmissionOutside = parms.getVec3fa("transmissionOutside",one);
      const Vec3fa transmissionInside  = parms.getVec3fa("transmission",one);
      const float etaOutside = parms.getFloat("etaOutside",1.0f);
      const float etaInside  = parms.getFloat("etaInside",1.4f);
      return new DielectricMaterial(transmissionOutside,transmissionInside,etaOutside,etaInside);
    }
    else if (type == "MetallicPaint")
    {
      const Vec3fa shadeColor    = parms.getVec3fa("shadeColor",one);
      const Vec3fa glitterColor  = parms.getVec3fa("glitterColor",zero);
      const float glitterSpread = parms.getFloat("glitterSpread",1.0f);
      const float eta           = parms.getFloat("eta",1.4f);
      return new MetallicPaintMaterial(shadeColor,glitterColor,glitterSpread,eta);
    }
    else if (type == "Hair")
    {
      const Vec3fa Kr = parms.getVec3fa("Kr",one);
      const Vec3fa Kt = parms.getVec3fa("Kt",zero);
      const float nx = parms.getFloat("nx",20.0f);
      const float ny = parms.getFloat("ny",2.0f);
      return new HairMaterial(Kr,Kt,nx,ny);
    }
    else {
      std::cout << "Warning: unsupported material " << type << std::endl;
      return new OBJMaterial(1.0f,Vec3fa(0.5f),Vec3fa(0.0f),0.0f);
    }
  }